

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XIncludeUtils::doDOMNodeXInclude
          (XIncludeUtils *this,DOMNode *xincludeNode,DOMDocument *parsedDocument,
          XMLEntityHandler *entityResolver)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long *plVar6;
  XMLCh *pXVar7;
  DOMNode *pDVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DOMText *pDVar9;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  DOMNode *pDVar10;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  long *plVar11;
  long *plVar12;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined8 uVar13;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  XMLCh *pXVar14;
  DOMNode *pDVar15;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  long *plVar16;
  undefined4 extraout_var_38;
  DOMNode *pDVar17;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  Codes CVar18;
  XMLSize_t i_1;
  ulong uVar19;
  undefined1 *puVar20;
  XMLSize_t i_2;
  XMLSize_t i;
  long lVar21;
  DOMDocument *local_168;
  XMLCh *local_158;
  XIncludeLocation hrefLoc;
  long local_148;
  XMLCh *local_140;
  XIncludeLocation relativeLocation;
  XIncludeLocation xil;
  RefVectorOf<xercesc_4_0::DOMNode> delayedProcessing;
  XMLUri includedURI;
  XMLUri parentURI;
  
  puVar20 = (undefined1 *)xincludeNode;
  iVar3 = (*xincludeNode->_vptr_DOMNode[5])(xincludeNode);
  pDVar10 = (DOMNode *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*xincludeNode->_vptr_DOMNode[0x1a])(xincludeNode);
  if ((char)iVar3 == '\0') {
    bVar1 = true;
    local_158 = (XMLCh *)0x0;
    local_168 = (DOMDocument *)0x0;
    local_140 = (XMLCh *)0x0;
  }
  else {
    iVar3 = (*xincludeNode->_vptr_DOMNode[0xb])(xincludeNode);
    plVar16 = (long *)CONCAT44(extraout_var_00,iVar3);
    lVar5 = (**(code **)(*plVar16 + 0x28))(plVar16);
    local_158 = (XMLCh *)0x0;
    local_148 = 0;
    local_168 = (DOMDocument *)0x0;
    local_140 = (XMLCh *)0x0;
    for (lVar21 = 0; lVar5 != lVar21; lVar21 = lVar21 + 1) {
      plVar6 = (long *)(**(code **)(*plVar16 + 0x18))(plVar16,lVar21);
      pXVar7 = (XMLCh *)(**(code **)(*plVar6 + 0x140))(plVar6);
      puVar20 = fgXIIncludeHREFAttrName;
      bVar1 = XMLString::equals(pXVar7,(XMLCh *)fgXIIncludeHREFAttrName);
      if (bVar1) {
        local_140 = (XMLCh *)(**(code **)(*plVar6 + 0x150))(plVar6);
      }
      else {
        puVar20 = fgXIIncludeParseAttrName;
        bVar1 = XMLString::equals(pXVar7,(XMLCh *)fgXIIncludeParseAttrName);
        if (bVar1) {
          local_168 = (DOMDocument *)(**(code **)(*plVar6 + 0x150))(plVar6);
        }
        else {
          puVar20 = fgXIIncludeXPointerAttrName;
          bVar1 = XMLString::equals(pXVar7,(XMLCh *)fgXIIncludeXPointerAttrName);
          if (bVar1) {
            local_148 = (**(code **)(*plVar6 + 0x150))(plVar6);
          }
          else {
            puVar20 = fgXIIncludeEncodingAttrName;
            bVar1 = XMLString::equals(pXVar7,(XMLCh *)fgXIIncludeEncodingAttrName);
            if (bVar1) {
              local_158 = (XMLCh *)(**(code **)(*plVar6 + 0x150))();
            }
            else {
              pXVar7 = (XMLCh *)(**(code **)(*plVar6 + 0xb0))(plVar6);
              if (pXVar7 != (XMLCh *)0x0) {
                puVar20 = fgXIIIncludeNamespaceURI;
                XMLString::equals(pXVar7,(XMLCh *)fgXIIIncludeNamespaceURI);
              }
            }
          }
        }
      }
    }
    bVar1 = local_148 == 0;
  }
  lVar5 = 0x50;
  lVar21 = 0x38;
  pDVar17 = (DOMNode *)0x0;
  pDVar8 = xincludeNode;
LAB_0032520d:
  do {
    do {
      pDVar8 = (DOMNode *)(**(code **)((long)pDVar8->_vptr_DOMNode + lVar21))(pDVar8);
      if (pDVar8 == (DOMNode *)0x0) {
        if (local_140 == (XMLCh *)0x0) {
          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
          local_140 = (XMLCh *)CONCAT44(extraout_var_07,iVar3);
          CVar18 = XIncludeNoHref;
LAB_003253e6:
          reportError(this,(DOMNode *)puVar20,CVar18,(XMLCh *)0x0,local_140);
          return false;
        }
        if (local_168 == (DOMDocument *)0x0) {
          local_168 = (DOMDocument *)0x352cd0;
        }
        if (!bVar1) {
          CVar18 = XIncludeXPointerNotSupported;
          goto LAB_003253e6;
        }
        XIncludeLocation::XIncludeLocation(&hrefLoc,local_140);
        XIncludeLocation::XIncludeLocation(&relativeLocation,local_140);
        iVar3 = (*xincludeNode->_vptr_DOMNode[0x1f])();
        if ((XMLCh *)CONCAT44(extraout_var_04,iVar3) != (XMLCh *)0x0) {
          XIncludeLocation::prependPath(&hrefLoc,(XMLCh *)CONCAT44(extraout_var_04,iVar3));
        }
        pXVar7 = getBaseAttrValue(xincludeNode);
        if (pXVar7 != (XMLCh *)0x0) {
          pXVar7 = getBaseAttrValue(xincludeNode);
          XIncludeLocation::prependPath(&relativeLocation,pXVar7);
        }
        bVar1 = XMLString::equals((XMLCh *)local_168,L"xml");
        if (bVar1) {
          local_168 = doXIncludeXMLFileDOM
                                (this,hrefLoc.fHref,relativeLocation.fHref,xincludeNode,
                                 parsedDocument,entityResolver);
          pDVar9 = (DOMText *)0x0;
        }
        else {
          puVar20 = fgXIIncludeParseAttrTextValue;
          bVar1 = XMLString::equals((XMLCh *)local_168,(XMLCh *)fgXIIncludeParseAttrTextValue);
          if (!bVar1) {
            iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                              (parsedDocument);
            reportError(this,(DOMNode *)puVar20,XIncludeInvalidParseVal,(XMLCh *)local_168,
                        (XMLCh *)CONCAT44(extraout_var_38,iVar3));
            bVar1 = false;
            goto LAB_00325c35;
          }
          pDVar9 = doXIncludeTEXTFileDOM
                             (this,hrefLoc.fHref,relativeLocation.fHref,local_158,xincludeNode,
                              parsedDocument,entityResolver);
          local_168 = (DOMDocument *)0x0;
        }
        pDVar8 = (DOMNode *)0xc;
        RefVectorOf<xercesc_4_0::DOMNode>::RefVectorOf
                  (&delayedProcessing,0xc,false,XMLPlatformUtils::fgMemoryManager);
        if (local_168 == (DOMDocument *)0x0 && pDVar9 == (DOMText *)0x0) {
          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                            (parsedDocument);
          reportError(this,pDVar8,XIncludeIncludeFailedResourceError,hrefLoc.fHref,
                      (XMLCh *)CONCAT44(extraout_var_08,iVar3));
          pDVar15 = &parsedDocument->super_DOMNode;
          if (pDVar10 != (DOMNode *)0x0) {
            pDVar15 = pDVar10;
          }
          if (pDVar17 == (DOMNode *)0x0) {
            iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                              (parsedDocument);
            iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                              (parsedDocument);
            reportError(this,pDVar8,XIncludeIncludeFailedNoFallback,
                        (XMLCh *)CONCAT44(extraout_var_39,iVar3),
                        (XMLCh *)CONCAT44(extraout_var_40,iVar4));
LAB_00325be2:
            bVar1 = false;
            goto LAB_00325c2b;
          }
          iVar3 = (*pDVar15->_vptr_DOMNode[0x1f])(pDVar15);
          XMLUri::XMLUri(&parentURI,(XMLCh *)CONCAT44(extraout_var_09,iVar3),
                         XMLPlatformUtils::fgMemoryManager);
          iVar3 = (*pDVar17->_vptr_DOMNode[0x1f])(pDVar17);
          XMLUri::XMLUri(&includedURI,(XMLCh *)CONCAT44(extraout_var_10,iVar3),
                         XMLPlatformUtils::fgMemoryManager);
          iVar3 = (*pDVar17->_vptr_DOMNode[0x12])(pDVar17);
          if ((char)iVar3 == '\0') {
            (*pDVar15->_vptr_DOMNode[0x10])(pDVar15,xincludeNode);
          }
          else {
            iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
            plVar16 = (long *)CONCAT44(extraout_var_11,iVar3);
            iVar3 = (*pDVar17->_vptr_DOMNode[7])(pDVar17);
            for (plVar6 = (long *)CONCAT44(extraout_var_12,iVar3); plVar6 != (long *)0x0;
                plVar6 = (long *)(**(code **)(*plVar6 + 0x50))(plVar6)) {
              iVar3 = (**(code **)(*plVar6 + 0x20))(plVar6);
              if (iVar3 != 10) {
                iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                                  (parsedDocument,plVar6,1);
                pDVar10 = (DOMNode *)CONCAT44(extraout_var_13,iVar3);
                iVar3 = (*pDVar10->_vptr_DOMNode[4])(pDVar10);
                if ((iVar3 == 1) &&
                   (bVar1 = XMLString::equals(parentURI.fPath,includedURI.fPath), !bVar1)) {
                  pXVar7 = getBaseAttrValue(pDVar10);
                  if (pXVar7 == (XMLCh *)0x0) {
                    iVar3 = (*pDVar17->_vptr_DOMNode[5])(pDVar17);
                    pXVar7 = getBaseAttrValue((DOMNode *)CONCAT44(extraout_var_16,iVar3));
                    (*pDVar10->_vptr_DOMNode[0x2c])(pDVar10,fgXIBaseAttrName,pXVar7);
                  }
                  else {
                    pXVar7 = getBaseAttrValue(pDVar10);
                    XIncludeLocation::XIncludeLocation(&xil,pXVar7);
                    iVar3 = (*pDVar17->_vptr_DOMNode[5])(pDVar17);
                    pXVar7 = getBaseAttrValue((DOMNode *)CONCAT44(extraout_var_14,iVar3));
                    if (pXVar7 != (XMLCh *)0x0) {
                      iVar3 = (*pDVar17->_vptr_DOMNode[5])(pDVar17);
                      pXVar7 = getBaseAttrValue((DOMNode *)CONCAT44(extraout_var_15,iVar3));
                      XIncludeLocation::prependPath(&xil,pXVar7);
                    }
                    (*pDVar10->_vptr_DOMNode[0x2c])(pDVar10,fgXIBaseAttrName,xil.fHref);
                    XIncludeLocation::~XIncludeLocation(&xil);
                  }
                }
                pDVar10 = (DOMNode *)(**(code **)(*plVar16 + 0x88))(plVar16,pDVar10);
                BaseRefVectorOf<xercesc_4_0::DOMNode>::addElement
                          (&delayedProcessing.super_BaseRefVectorOf<xercesc_4_0::DOMNode>,pDVar10);
              }
            }
            (*pDVar15->_vptr_DOMNode[0xf])(pDVar15,plVar16,xincludeNode);
            (**(code **)(*plVar16 + 0x138))(plVar16);
            for (uVar19 = 0;
                uVar19 < delayedProcessing.super_BaseRefVectorOf<xercesc_4_0::DOMNode>.fCurCount;
                uVar19 = uVar19 + 1) {
              pDVar10 = BaseRefVectorOf<xercesc_4_0::DOMNode>::elementAt
                                  (&delayedProcessing.super_BaseRefVectorOf<xercesc_4_0::DOMNode>,
                                   uVar19);
              parseDOMNodeDoingXInclude(this,pDVar10,parsedDocument,entityResolver);
            }
          }
          XMLUri::~XMLUri(&includedURI);
          XMLUri::~XMLUri(&parentURI);
        }
        else {
          if (local_168 == (DOMDocument *)0x0) {
            if (pDVar9 == (DOMText *)0x0) goto LAB_00325be2;
            bVar1 = true;
            (*pDVar10->_vptr_DOMNode[0xf])(pDVar10,pDVar9,xincludeNode);
            goto LAB_00325c2b;
          }
          addDocumentURIToCurrentInclusionHistoryStack(this,hrefLoc.fHref);
          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])
                            (parsedDocument);
          pDVar8 = (DOMNode *)CONCAT44(extraout_var_17,iVar3);
          iVar3 = (*(local_168->super_DOMNode)._vptr_DOMNode[7])(&local_168->super_DOMNode);
          pDVar17 = &parsedDocument->super_DOMNode;
          for (plVar16 = (long *)CONCAT44(extraout_var_18,iVar3); plVar16 != (long *)0x0;
              plVar16 = (long *)(**(code **)(*plVar16 + 0x50))(plVar16)) {
            iVar3 = (**(code **)(*plVar16 + 0x20))(plVar16);
            if (iVar3 != 10) {
              iVar3 = (**(code **)(*plVar16 + 0x20))(plVar16);
              if ((iVar3 == 1) &&
                 (iVar3 = (*(local_168->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(),
                 CONCAT44(extraout_var_19,iVar3) != 0)) {
                plVar6 = (long *)(**(code **)(*plVar16 + 0x58))();
                lVar5 = (**(code **)(*plVar6 + 0x28))(plVar6);
                for (lVar21 = 0; lVar5 != lVar21; lVar21 = lVar21 + 1) {
                  plVar11 = (long *)(**(code **)(*plVar6 + 0x18))(plVar6,lVar21);
                  plVar12 = (long *)(**(code **)(*plVar11 + 0x170))(plVar11);
                  if (plVar12 != (long *)0x0) {
                    pXVar7 = (XMLCh *)(**(code **)(*plVar12 + 0x18))(plVar12);
                    bVar1 = XMLString::equals(pXVar7,(XMLCh *)XMLUni::fgInfosetURIName);
                    if (bVar1) {
                      pXVar7 = (XMLCh *)(**(code **)(*plVar12 + 0x10))(plVar12);
                      bVar1 = XMLString::equals(pXVar7,(XMLCh *)XMLUni::fgNotationString);
                      if (bVar1) {
                        pXVar7 = (XMLCh *)(**(code **)(*plVar11 + 0x18))(plVar11);
                        iVar3 = (*(local_168->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])()
                        ;
                        plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_20,iVar3) +
                                                      0x150))((long *)CONCAT44(extraout_var_20,iVar3
                                                                              ));
                        plVar11 = (long *)(**(code **)(*plVar11 + 0x20))(plVar11,pXVar7);
                        iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])();
                        if (CONCAT44(extraout_var_21,iVar3) == 0) {
                          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xd])();
                          uVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar3) + 0x10))
                                             ((long *)CONCAT44(extraout_var_22,iVar3));
                          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0x24])(parsedDocument,uVar13,0,0);
                          iVar4 = (*pDVar17->_vptr_DOMNode[7])();
                          (*pDVar17->_vptr_DOMNode[0xe])
                                    (pDVar17,CONCAT44(extraout_var_23,iVar3),
                                     CONCAT44(extraout_var_24,iVar4));
                        }
                        iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])();
                        plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_25,iVar3) +
                                                      0x150))((long *)CONCAT44(extraout_var_25,iVar3
                                                                              ));
                        plVar12 = (long *)(**(code **)(*plVar12 + 0x20))(plVar12,pXVar7);
                        if (plVar12 == (long *)0x0) {
                          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xb])();
                          plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_34,iVar3) +
                                                        0x150))((long *)CONCAT44(extraout_var_34,
                                                                                 iVar3));
                          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xf])(parsedDocument,plVar11,1);
                          (**(code **)(*plVar12 + 0x10))(plVar12,iVar3);
                        }
                        else {
                          pXVar14 = (XMLCh *)(**(code **)(*plVar12 + 0x140))(plVar12);
                          pDVar15 = (DOMNode *)(**(code **)(*plVar11 + 0x140))(plVar11);
                          bVar1 = XMLString::equals(pXVar14,(XMLCh *)pDVar15);
                          if (bVar1) {
                            pXVar14 = (XMLCh *)(**(code **)(*plVar12 + 0x148))(plVar12);
                            pDVar15 = (DOMNode *)(**(code **)(*plVar11 + 0x148))(plVar11);
                            bVar1 = XMLString::equals(pXVar14,(XMLCh *)pDVar15);
                            if (bVar1) {
                              pXVar14 = (XMLCh *)(**(code **)(*plVar12 + 0xf8))(plVar12);
                              pDVar15 = (DOMNode *)(**(code **)(*plVar11 + 0xf8))(plVar11);
                              bVar1 = XMLString::equals(pXVar14,(XMLCh *)pDVar15);
                              if (bVar1) goto LAB_00325ab9;
                            }
                          }
                          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0x1a])();
                          reportError(this,pDVar15,XIncludeConflictingNotation,pXVar7,
                                      (XMLCh *)CONCAT44(extraout_var_26,iVar3));
                        }
                      }
                      else {
                        pXVar7 = (XMLCh *)(**(code **)(*plVar12 + 0x10))(plVar12);
                        bVar1 = XMLString::equals(pXVar7,(XMLCh *)XMLUni::fgEntityString);
                        if (bVar1) {
                          pXVar7 = (XMLCh *)(**(code **)(*plVar11 + 0x18))(plVar11);
                          iVar3 = (*(local_168->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])
                                            ();
                          plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_27,iVar3) +
                                                        0x148))((long *)CONCAT44(extraout_var_27,
                                                                                 iVar3));
                          plVar11 = (long *)(**(code **)(*plVar11 + 0x20))(plVar11,pXVar7);
                          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xb])();
                          if (CONCAT44(extraout_var_28,iVar3) == 0) {
                            iVar3 = (*(parsedDocument->super_DOMDocumentRange).
                                      _vptr_DOMDocumentRange[0xd])();
                            uVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_29,iVar3) + 0x10))
                                               ((long *)CONCAT44(extraout_var_29,iVar3));
                            iVar3 = (*(parsedDocument->super_DOMDocumentRange).
                                      _vptr_DOMDocumentRange[0x24])(parsedDocument,uVar13,0,0);
                            iVar4 = (*pDVar17->_vptr_DOMNode[7])();
                            (*pDVar17->_vptr_DOMNode[0xe])
                                      (pDVar17,CONCAT44(extraout_var_30,iVar3),
                                       CONCAT44(extraout_var_31,iVar4));
                          }
                          iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xb])();
                          plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_32,iVar3) +
                                                        0x148))((long *)CONCAT44(extraout_var_32,
                                                                                 iVar3));
                          plVar12 = (long *)(**(code **)(*plVar12 + 0x20))(plVar12,pXVar7);
                          if (plVar12 == (long *)0x0) {
                            iVar3 = (*(parsedDocument->super_DOMDocumentRange).
                                      _vptr_DOMDocumentRange[0xb])();
                            plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_35,iVar3)
                                                          + 0x148))
                                                        ((long *)CONCAT44(extraout_var_35,iVar3));
                            iVar3 = (*(parsedDocument->super_DOMDocumentRange).
                                      _vptr_DOMDocumentRange[0xf])(parsedDocument,plVar11,1);
                            (**(code **)(*plVar12 + 0x10))(plVar12,iVar3);
                          }
                          else {
                            pXVar14 = (XMLCh *)(**(code **)(*plVar12 + 0x140))(plVar12);
                            pDVar15 = (DOMNode *)(**(code **)(*plVar11 + 0x140))(plVar11);
                            bVar1 = XMLString::equals(pXVar14,(XMLCh *)pDVar15);
                            if (bVar1) {
                              pXVar14 = (XMLCh *)(**(code **)(*plVar12 + 0x148))(plVar12);
                              pDVar15 = (DOMNode *)(**(code **)(*plVar11 + 0x148))(plVar11);
                              bVar1 = XMLString::equals(pXVar14,(XMLCh *)pDVar15);
                              if (bVar1) {
                                pXVar14 = (XMLCh *)(**(code **)(*plVar12 + 0xf8))(plVar12);
                                pDVar15 = (DOMNode *)(**(code **)(*plVar11 + 0xf8))(plVar11);
                                bVar1 = XMLString::equals(pXVar14,(XMLCh *)pDVar15);
                                if (bVar1) goto LAB_00325ab9;
                              }
                            }
                            iVar3 = (*(parsedDocument->super_DOMDocumentRange).
                                      _vptr_DOMDocumentRange[0x1a])();
                            reportError(this,pDVar15,XIncludeConflictingEntity,pXVar7,
                                        (XMLCh *)CONCAT44(extraout_var_33,iVar3));
                          }
                        }
                      }
                    }
                  }
LAB_00325ab9:
                }
              }
              iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                                (parsedDocument,plVar16,1);
              iVar3 = (*pDVar8->_vptr_DOMNode[0x11])(pDVar8,CONCAT44(extraout_var_36,iVar3));
              BaseRefVectorOf<xercesc_4_0::DOMNode>::addElement
                        (&delayedProcessing.super_BaseRefVectorOf<xercesc_4_0::DOMNode>,
                         (DOMNode *)CONCAT44(extraout_var_37,iVar3));
            }
          }
          pDVar17 = pDVar8;
          (*pDVar10->_vptr_DOMNode[0xf])(pDVar10,pDVar8,xincludeNode);
          (*pDVar8->_vptr_DOMNode[0x27])();
          for (uVar19 = 0;
              uVar19 < delayedProcessing.super_BaseRefVectorOf<xercesc_4_0::DOMNode>.fCurCount;
              uVar19 = uVar19 + 1) {
            pDVar17 = BaseRefVectorOf<xercesc_4_0::DOMNode>::elementAt
                                (&delayedProcessing.super_BaseRefVectorOf<xercesc_4_0::DOMNode>,
                                 uVar19);
            parseDOMNodeDoingXInclude(this,pDVar17,parsedDocument,entityResolver);
          }
          popFromCurrentInclusionHistoryStack(this,(XMLCh *)pDVar17);
        }
        bVar1 = true;
        if (local_168 != (DOMDocument *)0x0) {
          (*(local_168->super_DOMNode)._vptr_DOMNode[0x27])(&local_168->super_DOMNode);
        }
LAB_00325c2b:
        RefVectorOf<xercesc_4_0::DOMNode>::~RefVectorOf(&delayedProcessing);
LAB_00325c35:
        XIncludeLocation::~XIncludeLocation(&relativeLocation);
        XIncludeLocation::~XIncludeLocation(&hrefLoc);
        return bVar1;
      }
      iVar3 = (*pDVar8->_vptr_DOMNode[4])(pDVar8);
      lVar21 = lVar5;
    } while (iVar3 != 1);
    bVar2 = isXIFallbackDOMNode(pDVar8);
    if (!bVar2) {
      bVar2 = isXIIncludeDOMNode(pDVar8);
      if (!bVar2) {
        iVar3 = (*pDVar8->_vptr_DOMNode[0x16])(pDVar8);
        puVar20 = fgXIIIncludeNamespaceURI;
        bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar3),
                                  (XMLCh *)fgXIIIncludeNamespaceURI);
        if (!bVar2) goto LAB_0032520d;
      }
      iVar3 = (*pDVar8->_vptr_DOMNode[2])(pDVar8);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_05,iVar3);
      iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
      pXVar14 = (XMLCh *)CONCAT44(extraout_var_06,iVar3);
      CVar18 = XIncludeDisallowedChild;
      goto LAB_003253a2;
    }
    bVar2 = pDVar17 != (DOMNode *)0x0;
    pDVar17 = pDVar8;
    if (bVar2) {
      iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                        (parsedDocument);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_02,iVar3);
      iVar3 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                        (parsedDocument);
      pXVar14 = (XMLCh *)CONCAT44(extraout_var_03,iVar3);
      CVar18 = XIncludeMultipleFallbackElems;
LAB_003253a2:
      reportError(this,(DOMNode *)puVar20,CVar18,pXVar7,pXVar14);
      return false;
    }
  } while( true );
}

Assistant:

bool
XIncludeUtils::doDOMNodeXInclude(DOMNode *xincludeNode, DOMDocument *parsedDocument, XMLEntityHandler* entityResolver){
    bool modifiedNode = false;
    /* the relevant attributes to look for */
    const XMLCh *href = NULL;
    const XMLCh *parse = NULL;
    const XMLCh *xpointer = NULL;
    const XMLCh *encoding = NULL;
//    const XMLCh *accept = NULL;
//    const XMLCh *acceptlanguage = NULL;
    DOMNode *includeParent = xincludeNode->getParentNode();


    if(xincludeNode->hasAttributes()) {
        /* get all the attributes of the node */
        DOMNamedNodeMap *pAttributes = xincludeNode->getAttributes();
        XMLSize_t nSize = pAttributes->getLength();
        for(XMLSize_t i=0;i<nSize;++i) {
            DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
            const XMLCh *attrName = pAttributeNode->getName();
            /* check each attribute against the potential useful names */
            if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeHREFAttrName)){
                href = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeParseAttrName)){
                parse = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeXPointerAttrName)){
                xpointer = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeEncodingAttrName)){
                encoding = pAttributeNode->getValue();
//            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeAcceptAttrName)){
//                accept = pAttributeNode->getValue();
//            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeAcceptLanguageAttrName)){
//                acceptlanguage = pAttributeNode->getValue();
            } else {
                /* if any other attribute is in the xi namespace, it's an error */
                const XMLCh *attrNamespaceURI = pAttributeNode->getNamespaceURI();
                if (attrNamespaceURI && XMLString::equals(attrNamespaceURI, XIncludeUtils::fgXIIIncludeNamespaceURI)){
                } else {
                    /* ignore - any other attribute is allowed according to spec,
                       and must be ignored */
                }
            }
        }
    }
    // 3.1 xi:include Element
    // The children property of the xi:include element may include a single xi:fallback element;
    // the appearance of more than one xi:fallback element, an xi:include element,
    // or any other element from the XInclude namespace is a fatal error.
    DOMNode *child;
    DOMElement *fallback = NULL;
    for (child = xincludeNode->getFirstChild(); child != 0; child=child->getNextSibling()){
        if(child->getNodeType()!=DOMNode::ELEMENT_NODE)
            continue;
        if ( isXIFallbackDOMNode(child) ){
            if (fallback != NULL){
                /* fatal error - there are more than one fallback children */
                XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeMultipleFallbackElems,
                    parsedDocument->getDocumentURI(), parsedDocument->getDocumentURI());
                return false;
            }
            fallback = (DOMElement*)child;
        }
        else if(isXIIncludeDOMNode(child) || XMLString::equals(child->getNamespaceURI(), XIncludeUtils::fgXIIIncludeNamespaceURI)) {
            /* fatal error - an xi element different from xi:fallback is a child of xi:include */
            XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeDisallowedChild,
                child->getNodeName(), parsedDocument->getDocumentURI());
            return false;
        }
    }

    if (href == NULL){
        /* this is an unrecoverable error until we have xpointer support -
           if there is an xpointer, the current document is assumed
           however, there is no xpointer support yet */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeNoHref,
            NULL, parsedDocument->getDocumentURI());
        return false;
    }

    /* set up the accept and accept-language values */
//    if (accept != NULL){
//
//    }

    if (parse == NULL){
        /* use the default, as specified */
        parse = XIncludeUtils::fgXIIncludeParseAttrXMLValue;
    }

    if (xpointer != NULL){
        /* not supported yet */
        /* Note that finding an xpointer attr along with parse="text" is a Fatal Error
         *  - http://www.w3.org/TR/xinclude/#include-location */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeXPointerNotSupported,
            NULL, href);
        return false;
    }

    /* set up the href according to what has gone before */
    XIncludeLocation hrefLoc(href);
    XIncludeLocation relativeLocation(href);
    const XMLCh *includeBase = xincludeNode->getBaseURI();
    if (includeBase != NULL){
        hrefLoc.prependPath(includeBase);
    }

    if (getBaseAttrValue(xincludeNode) != NULL){
        relativeLocation.prependPath(getBaseAttrValue(xincludeNode));
    }

    /*  Take the relevant action - we need to retrieve the target as a whole before
        we can know if it was successful or not, therefore the do* methods do
        not modify the parsedDocument. Swapping the results in is left to the
        caller (i.e. here) */
    DOMText *includedText = NULL;
    DOMDocument *includedDoc = NULL;
    if (XMLString::equals(parse, XIncludeUtils::fgXIIncludeParseAttrXMLValue)){
        /* including a XML element */
        includedDoc = doXIncludeXMLFileDOM(hrefLoc.getLocation(), relativeLocation.getLocation(), xincludeNode, parsedDocument, entityResolver);
    } else if (XMLString::equals(parse, XIncludeUtils::fgXIIncludeParseAttrTextValue)){
        /* including a text value */
        includedText = doXIncludeTEXTFileDOM(hrefLoc.getLocation(), relativeLocation.getLocation(), encoding, xincludeNode, parsedDocument, entityResolver);
    } else {
        /* invalid parse attribute value - fatal error according to the specification */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeInvalidParseVal,
            parse, parsedDocument->getDocumentURI());
        return false;
    }

    RefVectorOf<DOMNode> delayedProcessing(12,false);
    if (includedDoc == NULL && includedText == NULL){
        /* there was an error - this is now a resource error
           let's see if there is a fallback */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeIncludeFailedResourceError,
            hrefLoc.getLocation(), parsedDocument->getDocumentURI());

        if (includeParent == NULL){
            includeParent = parsedDocument;
        }

        // we could be getting errors trying to insert elements at the root of the document, so we should use replaceChild;
        // in order to handle multiple nodes, add them to a document fragment and use that to replace the original node
        if (fallback){
            /* baseURI fixups - see http://www.w3.org/TR/xinclude/#base for details. */
            XMLUri parentURI(includeParent->getBaseURI());
            XMLUri includedURI(fallback->getBaseURI());

            if (fallback->hasChildNodes()){
                DOMDocumentFragment* frag = parsedDocument->createDocumentFragment();
                DOMNode *child = fallback->getFirstChild();
                /* add the content of the fallback element, and remove the fallback elem itself */
                for ( ; child != NULL ; child=child->getNextSibling()){
                    if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE){
                        continue;
                    }
                    DOMNode *newNode = parsedDocument->importNode(child, true);
                    /* if the paths differ we need to add a base attribute */
                    if (newNode->getNodeType()==DOMNode::ELEMENT_NODE && !XMLString::equals(parentURI.getPath(), includedURI.getPath())){
                        if (getBaseAttrValue(newNode) == NULL){
                            /* need to calculate the proper path difference to get the relativePath */
                            ((DOMElement*)newNode)->setAttribute(fgXIBaseAttrName, getBaseAttrValue(fallback->getParentNode()));
                        } else {
                            /* the included node has base of its own which takes precedence */
                            XIncludeLocation xil(getBaseAttrValue(newNode));
                            if (getBaseAttrValue(fallback->getParentNode()) != NULL){
                                /* prepend any specific base modification of the xinclude node */
                                xil.prependPath(getBaseAttrValue(fallback->getParentNode()));
                            }
                            ((DOMElement*)newNode)->setAttribute(fgXIBaseAttrName, xil.getLocation());
                        }
                    }
                    DOMNode *newChild = frag->appendChild(newNode);
                    // don't process the node now, wait until it is placed in the final position
                    delayedProcessing.addElement(newChild);
                    //parseDOMNodeDoingXInclude(newChild, parsedDocument, entityResolver);
                }
                includeParent->replaceChild(frag, xincludeNode);
                frag->release();

                for(XMLSize_t i=0;i<delayedProcessing.size();i++)
                {
                    DOMNode* childNode=delayedProcessing.elementAt(i);
                    parseDOMNodeDoingXInclude(childNode, parsedDocument, entityResolver);
                }
                modifiedNode = true;
            } else {
                /* empty fallback element - simply remove it! */
                includeParent->removeChild(xincludeNode);
                modifiedNode = true;
            }
        } else {
            XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeIncludeFailedNoFallback,
                parsedDocument->getDocumentURI(), parsedDocument->getDocumentURI());
            return false;
        }
    } else {
        if (includedDoc){
            /* record the successful include while we process the children */
            addDocumentURIToCurrentInclusionHistoryStack(hrefLoc.getLocation());

            DOMDocumentFragment* frag = parsedDocument->createDocumentFragment();
            /* need to import the document prolog here */
            DOMNode *child = includedDoc->getFirstChild();
            for (; child != NULL; child = child->getNextSibling()) {
                if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE)
                    continue;
                // check for NOTATION or ENTITY clash
                if(child->getNodeType()==DOMNode::ELEMENT_NODE && includedDoc->getDoctype()!=NULL) {
                    DOMNamedNodeMap *pAttributes = child->getAttributes();
                    XMLSize_t nSize = pAttributes->getLength();
                    for(XMLSize_t i=0;i<nSize;++i) {
                        DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                        const DOMTypeInfo * typeInfo=pAttributeNode->getSchemaTypeInfo();
                        if(typeInfo && XMLString::equals(typeInfo->getTypeNamespace(), XMLUni::fgInfosetURIName)) {
                            if(XMLString::equals(typeInfo->getTypeName(), XMLUni::fgNotationString)) {
                                const XMLCh* notationName=pAttributeNode->getNodeValue();
                                DOMNotation* notat=(DOMNotation*)includedDoc->getDoctype()->getNotations()->getNamedItem(notationName);
                                // ensure we have a DTD
                                if(parsedDocument->getDoctype()==NULL)
                                    parsedDocument->insertBefore(parsedDocument->createDocumentType(parsedDocument->getDocumentElement()->getNodeName(), NULL,NULL), parsedDocument->getFirstChild());
                                DOMNotation* myNotation=(DOMNotation*)parsedDocument->getDoctype()->getNotations()->getNamedItem(notationName);
                                if(myNotation==NULL)
                                {
                                    // it's missing, add it
                                    parsedDocument->getDoctype()->getNotations()->setNamedItem(parsedDocument->importNode(notat, true));
                                }
                                else if(XMLString::equals(myNotation->getPublicId(), notat->getPublicId()) &&
                                        XMLString::equals(myNotation->getSystemId(), notat->getSystemId()) &&
                                        XMLString::equals(myNotation->getBaseURI(), notat->getBaseURI()))
                                {
                                    // it's duplicate, ignore it
                                }
                                else
                                {
                                    // it's a conflict, report it
                                    XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeConflictingNotation,
                                        notationName, parsedDocument->getDocumentURI());
                                }
                            }
                            else if(XMLString::equals(typeInfo->getTypeName(), XMLUni::fgEntityString)) {
                                const XMLCh* entityName=pAttributeNode->getNodeValue();
                                DOMEntity* ent=(DOMEntity*)includedDoc->getDoctype()->getEntities()->getNamedItem(entityName);
                                // ensure we have a DTD
                                if(parsedDocument->getDoctype()==NULL)
                                    parsedDocument->insertBefore(parsedDocument->createDocumentType(parsedDocument->getDocumentElement()->getNodeName(), NULL,NULL), parsedDocument->getFirstChild());
                                DOMEntity* myEnt=(DOMEntity*)parsedDocument->getDoctype()->getEntities()->getNamedItem(entityName);
                                if(myEnt==NULL)
                                {
                                    // it's missing, add it
                                    parsedDocument->getDoctype()->getEntities()->setNamedItem(parsedDocument->importNode(ent, true));
                                }
                                else if(XMLString::equals(myEnt->getPublicId(), ent->getPublicId()) &&
                                        XMLString::equals(myEnt->getSystemId(), ent->getSystemId()) &&
                                        XMLString::equals(myEnt->getBaseURI(), ent->getBaseURI()))
                                {
                                    // it's duplicate, ignore it
                                }
                                else
                                {
                                    // it's a conflict, report it
                                    XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeConflictingEntity,
                                        entityName, parsedDocument->getDocumentURI());
                                }
                            }
                        }
                    }
                }
                DOMNode *newNode = parsedDocument->importNode(child, true);
                DOMNode *newChild = frag->appendChild(newNode);
                // don't process the node now, wait until it is placed in the final position
                delayedProcessing.addElement(newChild);
                //parseDOMNodeDoingXInclude(newChild, parsedDocument, entityResolver);
            }
            includeParent->replaceChild(frag, xincludeNode);
            frag->release();

            for(XMLSize_t i=0;i<delayedProcessing.size();i++)
            {
                DOMNode* childNode=delayedProcessing.elementAt(i);
                parseDOMNodeDoingXInclude(childNode, parsedDocument, entityResolver);
            }
            popFromCurrentInclusionHistoryStack(NULL);
            modifiedNode = true;
        } else if (includedText){
            includeParent->replaceChild(includedText, xincludeNode);
            modifiedNode = true;
        }
    }

    if (includedDoc)
        includedDoc->release();

    return modifiedNode;
}